

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int32_t al_fread32be(ALLEGRO_FILE *f)

{
  uint uVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uchar b [4];
  
  b = SUB84((ulong)in_RAX >> 0x20,0);
  sVar2 = al_fread(f,b,4);
  if (sVar2 == 4) {
    uVar1 = (uint)b >> 0x18 | ((uint)b & 0xff0000) >> 8 | ((uint)b & 0xff00) << 8 | (int)b << 0x18;
  }
  else {
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

int32_t al_fread32be(ALLEGRO_FILE *f)
{
   unsigned char b[4];
   ASSERT(f);

   if (al_fread(f, b, 4) == 4) {
      return (((int32_t)b[0] << 24) | ((int32_t)b[1] << 16) |
              ((int32_t)b[2] << 8) | (int32_t)b[3]);
   }

   return EOF;
}